

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

int cdef_get_next_job(AV1CdefSync *cdef_sync,CdefSearchCtx *cdef_search_ctx,int *cur_fbr,
                     int *cur_fbc,int *sb_count)

{
  int nhfb_00;
  int iVar1;
  int *in_RCX;
  int *in_RDX;
  long in_RSI;
  AV1CdefSync *in_RDI;
  CommonModeInfoParams *in_R8;
  bool bVar2;
  int nhfb;
  int nvfb;
  int do_next_block;
  int fbc;
  int fbr;
  
  pthread_mutex_lock((pthread_mutex_t *)in_RDI->mutex_);
  fbr = 0;
  fbc = *(int *)(in_RSI + 0x1f00);
  nhfb_00 = *(int *)(in_RSI + 0x1f04);
  while( true ) {
    bVar2 = false;
    if (((in_RDI->cdef_mt_exit & 1U) == 0) && (bVar2 = false, in_RDI->end_of_frame == 0)) {
      iVar1 = cdef_sb_skip(in_R8,fbr,fbc);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    update_next_job_info(in_RDI,fbc,nhfb_00);
  }
  if (((in_RDI->cdef_mt_exit & 1U) == 0) && (in_RDI->end_of_frame == 0)) {
    fbr = 1;
    *in_RDX = in_RDI->fbr;
    *in_RCX = in_RDI->fbc;
    in_R8->mb_rows = *(int *)(in_RSI + 0x1f20);
    *(int *)(in_RSI + 0x1f20) = *(int *)(in_RSI + 0x1f20) + 1;
    update_next_job_info(in_RDI,fbc,nhfb_00);
  }
  pthread_mutex_unlock((pthread_mutex_t *)in_RDI->mutex_);
  return fbr;
}

Assistant:

static inline int cdef_get_next_job(AV1CdefSync *cdef_sync,
                                    CdefSearchCtx *cdef_search_ctx,
                                    volatile int *cur_fbr,
                                    volatile int *cur_fbc,
                                    volatile int *sb_count) {
#if CONFIG_MULTITHREAD
  pthread_mutex_lock(cdef_sync->mutex_);
#endif  // CONFIG_MULTITHREAD
  int do_next_block = 0;
  const int nvfb = cdef_search_ctx->nvfb;
  const int nhfb = cdef_search_ctx->nhfb;

  // If a block is skip, do not process the block and
  // check the skip condition for the next block.
  while (!cdef_sync->cdef_mt_exit && !cdef_sync->end_of_frame &&
         cdef_sb_skip(cdef_search_ctx->mi_params, cdef_sync->fbr,
                      cdef_sync->fbc)) {
    update_next_job_info(cdef_sync, nvfb, nhfb);
  }

  // Populates information needed for current job and update the row,
  // column indices of the next block to be processed.
  if (!cdef_sync->cdef_mt_exit && cdef_sync->end_of_frame == 0) {
    do_next_block = 1;
    *cur_fbr = cdef_sync->fbr;
    *cur_fbc = cdef_sync->fbc;
    *sb_count = cdef_search_ctx->sb_count;
    cdef_search_ctx->sb_count++;
    update_next_job_info(cdef_sync, nvfb, nhfb);
  }
#if CONFIG_MULTITHREAD
  pthread_mutex_unlock(cdef_sync->mutex_);
#endif  // CONFIG_MULTITHREAD
  return do_next_block;
}